

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

vector<CScript,_std::allocator<CScript>_> *
EvalDescriptorStringOrObject
          (vector<CScript,_std::allocator<CScript>_> *__return_storage_ptr__,UniValue *scanobject,
          FlatSigningProvider *provider,bool expand_priv)

{
  long lVar1;
  Descriptor *pDVar2;
  pointer puVar3;
  int iVar4;
  string *psVar5;
  reference pvVar6;
  UniValue *pUVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar8;
  pointer puVar9;
  long in_FS_OFFSET;
  bool bVar10;
  string_view key;
  string_view key_00;
  pair<long,_long> pVar11;
  ulong local_d8;
  vector<CScript,_std::allocator<CScript>_> scripts;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  string local_98;
  string error;
  string desc_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  desc_str._M_dataplus._M_p = (pointer)&desc_str.field_2;
  desc_str._M_string_length = 0;
  desc_str.field_2._M_local_buf[0] = '\0';
  if (scanobject->typ == VOBJ) {
    key._M_str = "desc";
    key._M_len = 4;
    pUVar7 = UniValue::find_value(scanobject,key);
    if (pUVar7->typ == VNULL) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"Descriptor needs to be provided in scan object",
                 (allocator<char> *)&local_98);
      JSONRPCError(pUVar7,-8,&error);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005bb8fb;
    }
    psVar5 = UniValue::get_str_abi_cxx11_(pUVar7);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&desc_str,psVar5);
    key_00._M_str = "range";
    key_00._M_len = 5;
    pUVar7 = UniValue::find_value(scanobject,key_00);
    if (pUVar7->typ == VNULL) goto LAB_005bb529;
    pVar11 = ParseDescriptorRange(pUVar7);
    local_d8 = pVar11.second;
    uVar8 = (ulong)(int)pVar11.first;
  }
  else {
    if (scanobject->typ != VSTR) {
      pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&error,"Scan object needs to be either a string or an object",
                 (allocator<char> *)&local_98);
      JSONRPCError(pUVar7,-8,&error);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_005bb8fb;
    }
    psVar5 = UniValue::get_str_abi_cxx11_(scanobject);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&desc_str,psVar5);
LAB_005bb529:
    local_d8 = 1000;
    uVar8 = 0;
  }
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  Parse(&descs,&desc_str,provider,&error,false);
  if (descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
    JSONRPCError(pUVar7,-5,&error);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    pvVar6 = std::
             vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             ::at(&descs,0);
    iVar4 = (*((pvVar6->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>.
               _M_t.super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
               super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor[2])();
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar10 = (char)iVar4 == '\0';
    if (bVar10) {
      local_d8 = 0;
    }
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CScript,_std::allocator<CScript>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (bVar10) {
      uVar8 = 0;
    }
    for (; puVar3 = descs.
                    super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
        puVar9 = descs.
                 super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, (long)uVar8 <= (long)local_d8;
        uVar8 = uVar8 + 1) {
      for (; puVar9 != puVar3; puVar9 = puVar9 + 1) {
        scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        pDVar2 = (puVar9->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>.
                 _M_t.super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                 super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scripts;
        iVar4 = (*pDVar2->_vptr_Descriptor[8])
                          (pDVar2,uVar8 & 0xffffffff,provider,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scripts,provider,0);
        if ((char)iVar4 == '\0') {
          pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
          tinyformat::format<std::__cxx11::string>
                    (&local_98,(tinyformat *)"Cannot derive script without private keys: \'%s\'",
                     (char *)&desc_str,args);
          JSONRPCError(pUVar7,-5,&local_98);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
          }
          goto LAB_005bb8fb;
        }
        if (expand_priv) {
          pDVar2 = (puVar9->_M_t).
                   super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                   super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                   super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
          (*pDVar2->_vptr_Descriptor[10])(pDVar2,uVar8 & 0xffffffff,provider,provider);
        }
        std::__copy_move<true,false,std::random_access_iterator_tag>::
        __copy_m<CScript*,std::back_insert_iterator<std::vector<CScript,std::allocator<CScript>>>>
                  (scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (back_insert_iterator<std::vector<CScript,_std::allocator<CScript>_>_>)
                   __return_storage_ptr__);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts);
      }
    }
    std::
    vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
    ::~vector(&descs);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&desc_str);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
LAB_005bb8fb:
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> EvalDescriptorStringOrObject(const UniValue& scanobject, FlatSigningProvider& provider, const bool expand_priv)
{
    std::string desc_str;
    std::pair<int64_t, int64_t> range = {0, 1000};
    if (scanobject.isStr()) {
        desc_str = scanobject.get_str();
    } else if (scanobject.isObject()) {
        const UniValue& desc_uni{scanobject.find_value("desc")};
        if (desc_uni.isNull()) throw JSONRPCError(RPC_INVALID_PARAMETER, "Descriptor needs to be provided in scan object");
        desc_str = desc_uni.get_str();
        const UniValue& range_uni{scanobject.find_value("range")};
        if (!range_uni.isNull()) {
            range = ParseDescriptorRange(range_uni);
        }
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Scan object needs to be either a string or an object");
    }

    std::string error;
    auto descs = Parse(desc_str, provider, error);
    if (descs.empty()) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, error);
    }
    if (!descs.at(0)->IsRange()) {
        range.first = 0;
        range.second = 0;
    }
    std::vector<CScript> ret;
    for (int i = range.first; i <= range.second; ++i) {
        for (const auto& desc : descs) {
            std::vector<CScript> scripts;
            if (!desc->Expand(i, provider, scripts, provider)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, strprintf("Cannot derive script without private keys: '%s'", desc_str));
            }
            if (expand_priv) {
                desc->ExpandPrivate(/*pos=*/i, provider, /*out=*/provider);
            }
            std::move(scripts.begin(), scripts.end(), std::back_inserter(ret));
        }
    }
    return ret;
}